

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.h
# Opt level: O1

ModBroadcastableLayerParams * __thiscall
CoreML::Specification::NeuralNetworkLayer::mutable_modbroadcastable(NeuralNetworkLayer *this)

{
  ModBroadcastableLayerParams *this_00;
  
  if (this->_oneof_case_[0] != 0x361) {
    clear_layer(this);
    this->_oneof_case_[0] = 0x361;
    this_00 = (ModBroadcastableLayerParams *)operator_new(0x18);
    ModBroadcastableLayerParams::ModBroadcastableLayerParams(this_00);
    (this->layer_).modbroadcastable_ = this_00;
  }
  return (ModBroadcastableLayerParams *)(this->layer_).convolution_;
}

Assistant:

inline ::CoreML::Specification::ModBroadcastableLayerParams* NeuralNetworkLayer::mutable_modbroadcastable() {
  if (!has_modbroadcastable()) {
    clear_layer();
    set_has_modbroadcastable();
    layer_.modbroadcastable_ = new ::CoreML::Specification::ModBroadcastableLayerParams;
  }
  // @@protoc_insertion_point(field_mutable:CoreML.Specification.NeuralNetworkLayer.modBroadcastable)
  return layer_.modbroadcastable_;
}